

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O1

void blend_a64_mask_b12_sx_w8n_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  uint8_t *puVar1;
  uint16_t *puVar2;
  long lVar3;
  undefined1 in_XMM0 [16];
  undefined1 auVar4 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar5 [16];
  uint16_t uVar6;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  uint16_t uVar15;
  uint16_t uVar16;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint16_t uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar8 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  auVar4 = pmovzxbw(in_XMM0,0xffffffffffffffff);
  auVar5 = pmovsxbw(in_XMM1,0x4040404040404040);
  do {
    if (0 < w) {
      lVar3 = 0;
      do {
        puVar1 = mask + lVar3 * 2;
        auVar18[0] = pavgb(puVar1[1],*puVar1);
        auVar18[1] = pavgb(0,puVar1[1]);
        auVar18[2] = pavgb(puVar1[3],puVar1[2]);
        auVar18[3] = pavgb(0,puVar1[3]);
        auVar18[4] = pavgb(puVar1[5],puVar1[4]);
        auVar18[5] = pavgb(0,puVar1[5]);
        auVar18[6] = pavgb(puVar1[7],puVar1[6]);
        auVar18[7] = pavgb(0,puVar1[7]);
        auVar18[8] = pavgb(puVar1[9],puVar1[8]);
        auVar18[9] = pavgb(0,puVar1[9]);
        auVar18[10] = pavgb(puVar1[0xb],puVar1[10]);
        auVar18[0xb] = pavgb(0,puVar1[0xb]);
        auVar18[0xc] = pavgb(puVar1[0xd],puVar1[0xc]);
        auVar18[0xd] = pavgb(0,puVar1[0xd]);
        auVar18[0xe] = pavgb(puVar1[0xf],puVar1[0xe]);
        auVar18[0xf] = pavgb(0,puVar1[0xf]);
        auVar18 = auVar18 & auVar4;
        auVar10 = *(undefined1 (*) [16])(src0 + lVar3);
        puVar2 = src1 + lVar3;
        auVar26._0_12_ = auVar18._0_12_;
        auVar26._12_2_ = auVar18._6_2_;
        auVar26._14_2_ = auVar5._6_2_ - auVar18._6_2_;
        auVar25._12_4_ = auVar26._12_4_;
        auVar25._0_10_ = auVar18._0_10_;
        auVar25._10_2_ = auVar5._4_2_ - auVar18._4_2_;
        auVar24._10_6_ = auVar25._10_6_;
        auVar24._0_8_ = auVar18._0_8_;
        auVar24._8_2_ = auVar18._4_2_;
        auVar23._8_8_ = auVar24._8_8_;
        auVar23._6_2_ = auVar5._2_2_ - auVar18._2_2_;
        auVar23._4_2_ = auVar18._2_2_;
        auVar23._2_2_ = auVar5._0_2_ - auVar18._0_2_;
        auVar23._0_2_ = auVar18._0_2_;
        auVar19._2_2_ = auVar5._8_2_ - auVar18._8_2_;
        auVar19._0_2_ = auVar18._8_2_;
        auVar19._4_2_ = auVar18._10_2_;
        auVar19._6_2_ = auVar5._10_2_ - auVar18._10_2_;
        auVar19._8_2_ = auVar18._12_2_;
        auVar19._10_2_ = auVar5._12_2_ - auVar18._12_2_;
        auVar19._12_2_ = auVar18._14_2_;
        auVar19._14_2_ = auVar5._14_2_ - auVar18._14_2_;
        auVar8._0_12_ = auVar10._0_12_;
        auVar8._12_2_ = auVar10._6_2_;
        auVar8._14_2_ = puVar2[3];
        auVar7._12_4_ = auVar8._12_4_;
        auVar7._0_10_ = auVar10._0_10_;
        auVar7._10_2_ = puVar2[2];
        auVar21._10_6_ = auVar7._10_6_;
        auVar21._0_8_ = auVar10._0_8_;
        auVar21._8_2_ = auVar10._4_2_;
        auVar9._8_8_ = auVar21._8_8_;
        auVar9._6_2_ = puVar2[1];
        auVar9._4_2_ = auVar10._2_2_;
        auVar9._0_2_ = auVar10._0_2_;
        auVar9._2_2_ = *puVar2;
        auVar9 = pmaddwd(auVar9,auVar23);
        auVar20._2_2_ = puVar2[4];
        auVar20._0_2_ = auVar10._8_2_;
        auVar20._4_2_ = auVar10._10_2_;
        auVar20._6_2_ = puVar2[5];
        auVar20._8_2_ = auVar10._12_2_;
        auVar20._10_2_ = puVar2[6];
        auVar20._12_2_ = auVar10._14_2_;
        auVar20._14_2_ = puVar2[7];
        auVar21 = pmaddwd(auVar20,auVar19);
        auVar10._0_4_ = auVar9._0_4_ >> 5;
        auVar10._4_4_ = auVar9._4_4_ >> 5;
        auVar10._8_4_ = auVar9._8_4_ >> 5;
        auVar10._12_4_ = auVar9._12_4_ >> 5;
        auVar22._0_4_ = auVar21._0_4_ >> 5;
        auVar22._4_4_ = auVar21._4_4_ >> 5;
        auVar22._8_4_ = auVar21._8_4_ >> 5;
        auVar22._12_4_ = auVar21._12_4_ >> 5;
        auVar10 = packssdw(auVar10,auVar22);
        uVar6 = pavgw(auVar10._0_2_,0);
        uVar11 = pavgw(auVar10._2_2_,0);
        uVar12 = pavgw(auVar10._4_2_,0);
        uVar13 = pavgw(auVar10._6_2_,0);
        uVar14 = pavgw(auVar10._8_2_,0);
        uVar15 = pavgw(auVar10._10_2_,0);
        uVar16 = pavgw(auVar10._12_2_,0);
        uVar17 = pavgw(auVar10._14_2_,0);
        puVar2 = dst + lVar3;
        *puVar2 = uVar6;
        puVar2[1] = uVar11;
        puVar2[2] = uVar12;
        puVar2[3] = uVar13;
        puVar2[4] = uVar14;
        puVar2[5] = uVar15;
        puVar2[6] = uVar16;
        puVar2[7] = uVar17;
        lVar3 = lVar3 + 8;
      } while ((int)lVar3 < w);
    }
    mask = mask + mask_stride;
    dst = dst + dst_stride;
    src1 = src1 + src1_stride;
    src0 = src0 + src0_stride;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_mask_b12_sx_w8n_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  blend_a64_mask_bn_sx_w8n_sse4_1(dst, dst_stride, src0, src0_stride, src1,
                                  src1_stride, mask, mask_stride, w, h,
                                  blend_8_b12);
}